

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  int iVar1;
  WalCkptInfo *pWVar2;
  int local_54;
  _func_int_void_ptr *local_50;
  _func_int_void_ptr *xBusy2;
  int eMode2;
  int isChanged;
  int rc;
  int sync_flags_local;
  void *pBusyArg_local;
  _func_int_void_ptr *xBusy_local;
  sqlite3 *psStack_20;
  int eMode_local;
  sqlite3 *db_local;
  Wal *pWal_local;
  
  xBusy2._4_4_ = 0;
  if (pWal->readOnly == '\0') {
    xBusy2._0_4_ = eMode;
    isChanged = sync_flags;
    _rc = pBusyArg;
    pBusyArg_local = xBusy;
    xBusy_local._4_4_ = eMode;
    psStack_20 = db;
    db_local = (sqlite3 *)pWal;
    eMode2 = walLockExclusive(pWal,1,1);
    pWal_local._4_4_ = eMode2;
    if (eMode2 == 0) {
      *(undefined1 *)((long)&db_local->openFlags + 1) = 1;
      local_50 = xBusy;
      if (xBusy_local._4_4_ != 0) {
        eMode2 = walBusyLock((Wal *)db_local,(_func_int_void_ptr *)pBusyArg_local,_rc,0,1);
        if (eMode2 == 0) {
          *(undefined1 *)&db_local->openFlags = 1;
        }
        else if (eMode2 == 5) {
          xBusy2._0_4_ = 0;
          local_50 = (_func_int_void_ptr *)0x0;
          eMode2 = 0;
        }
      }
      if (((eMode2 == 0) &&
          (eMode2 = walIndexReadHdr((Wal *)db_local,(int *)((long)&xBusy2 + 4)), xBusy2._4_4_ != 0))
         && (2 < *(int *)&db_local->pVdbe->db->pVfs)) {
        sqlite3OsUnfetch((sqlite3_file *)db_local->pVdbe,0,(void *)0x0);
      }
      if (eMode2 == 0) {
        iVar1._0_1_ = db_local->nextAutovac;
        iVar1._1_1_ = db_local->suppressErr;
        iVar1._2_1_ = db_local->vtabOnConflict;
        iVar1._3_1_ = db_local->isTransactionSavepoint;
        if ((iVar1 == 0) || (iVar1 = walPagesize((Wal *)db_local), iVar1 == nBuf)) {
          eMode2 = walCheckpoint((Wal *)db_local,psStack_20,(int)xBusy2,local_50,_rc,isChanged,zBuf)
          ;
        }
        else {
          eMode2 = sqlite3CorruptError(0xe3f7);
        }
        if ((eMode2 == 0) || (eMode2 == 5)) {
          if (pnLog != (int *)0x0) {
            *pnLog = *(int *)&db_local->nextAutovac;
          }
          if (pnCkpt != (int *)0x0) {
            pWVar2 = walCkptInfo((Wal *)db_local);
            *pnCkpt = pWVar2->nBackfill;
          }
        }
      }
      if (xBusy2._4_4_ != 0) {
        memset(&db_local->errMask,0,0x30);
      }
      sqlite3WalEndWriteTransaction((Wal *)db_local);
      walUnlockExclusive((Wal *)db_local,1,1);
      *(undefined1 *)((long)&db_local->openFlags + 1) = 0;
      if ((eMode2 == 0) && (xBusy_local._4_4_ != (int)xBusy2)) {
        local_54 = 5;
      }
      else {
        local_54 = eMode2;
      }
      pWal_local._4_4_ = local_54;
    }
  }
  else {
    pWal_local._4_4_ = 8;
  }
  return pWal_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}